

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

Float pbrt::InfiniteLightDensity
                (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *infiniteLights,
                LightSamplerHandle *lightSampler,Vector3f *w)

{
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *pTVar1;
  undefined1 auVar2 [16];
  anon_class_24_3_20c75c41 func;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *this;
  Float FVar3;
  undefined1 auVar4 [64];
  undefined1 auVar7 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  Vector3<float> VVar8;
  LightSamplingMode local_9c;
  undefined8 local_98;
  undefined8 local_90;
  float local_88;
  undefined8 *local_80;
  undefined8 *puStack_78;
  LightSamplingMode *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 extraout_var [60];
  
  this = (TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
          *)(infiniteLights->
            super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pTVar1 = (TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
            *)(infiniteLights->
              super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  auVar4 = ZEXT1664(ZEXT816(0) << 0x40);
  while( true ) {
    auVar7 = auVar4._8_56_;
    if (this == pTVar1) break;
    VVar8 = Tuple3<pbrt::Vector3,_float>::operator-(&w->super_Tuple3<pbrt::Vector3,_float>);
    local_88 = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar5._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar7;
    local_80 = &local_68;
    puStack_78 = &local_90;
    local_90 = vmovlps_avx(auVar5._0_16_);
    local_9c = WithoutMIS;
    local_68 = 0;
    uStack_60 = 0;
    uStack_58 = 0;
    uStack_50 = 0;
    uStack_48 = 0;
    uStack_40 = 0;
    func.wi = (Vector3f *)puStack_78;
    func.ctx = (LightSampleContext *)local_80;
    func.mode = &local_9c;
    local_70 = &local_9c;
    FVar3 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
            ::
            Dispatch<pbrt::LightHandle::PDF_Li(pbrt::LightSampleContext,pbrt::Vector3<float>,pbrt::LightSamplingMode)const::_lambda(auto:1)_1_>
                      (this,func);
    local_98 = *(undefined8 *)this;
    auVar6._0_4_ = TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                   ::
                   Dispatch<pbrt::LightSamplerHandle::PDF(pbrt::LightHandle)const::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::UniformLightSampler,pbrt::PowerLightSampler,pbrt::BVHLightSampler,pbrt::ExhaustiveLightSampler>
                               *)lightSampler,(LightHandle *)&local_98);
    auVar6._4_60_ = extraout_var;
    this = this + 8;
    auVar2 = vfmadd231ss_fma(ZEXT416((uint)auVar4._0_4_),auVar6._0_16_,ZEXT416((uint)FVar3));
    auVar4 = ZEXT464(auVar2._0_4_);
  }
  return auVar4._0_4_;
}

Assistant:

Float InfiniteLightDensity(const std::vector<LightHandle> &infiniteLights,
                           LightSamplerHandle lightSampler, const Vector3f &w) {
    Float pdf = 0;
    for (const auto &light : infiniteLights)
        pdf += light.PDF_Li(Interaction(), -w) * lightSampler.PDF(light);
    return pdf;
}